

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_carry_cap(parser *p)

{
  undefined2 uVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar2 = parser_getint(p,"value");
  if (wVar2 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar3 = strcmp(__s1,"pack-size");
    uVar1 = (undefined2)wVar2;
    if (iVar3 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x70) = uVar1;
    }
    else {
      iVar3 = strcmp(__s1,"quiver-size");
      if (iVar3 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x72) = uVar1;
      }
      else {
        iVar3 = strcmp(__s1,"quiver-slot-size");
        if (iVar3 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x74) = uVar1;
        }
        else {
          iVar3 = strcmp(__s1,"thrown-quiver-mult");
          if (iVar3 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x76) = uVar1;
          }
          else {
            iVar3 = strcmp(__s1,"floor-size");
            if (iVar3 != 0) {
              return PARSE_ERROR_UNDEFINED_DIRECTIVE;
            }
            *(undefined2 *)((long)pvVar4 + 0x78) = uVar1;
          }
        }
      }
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_carry_cap(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "pack-size"))
		z->pack_size = value;
	else if (streq(label, "quiver-size"))
		z->quiver_size = value;
	else if (streq(label, "quiver-slot-size"))
		z->quiver_slot_size = value;
	else if (streq(label, "thrown-quiver-mult"))
		z->thrown_quiver_mult = value;
	else if (streq(label, "floor-size"))
		z->floor_size = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}